

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  char *pcVar2;
  void *pvVar3;
  ImGuiColumns *pIVar4;
  Pair *pPVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  if (this->DrawList != &this->DrawListInst) {
    __assert_fail("DrawList == &DrawListInst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xa27,"ImGuiWindow::~ImGuiWindow()");
  }
  pcVar2 = this->Name;
  if (pcVar2 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  uVar7 = (this->ColumnsStorage).Size;
  if (uVar7 != 0) {
    lVar9 = 0x38;
    uVar8 = 0;
    do {
      if ((long)(int)uVar7 <= (long)uVar8) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,"T &ImVector<ImGuiColumns>::operator[](int) [T = ImGuiColumns]");
      }
      pvVar3 = *(void **)((long)&((this->ColumnsStorage).Data)->ID + lVar9);
      if (pvVar3 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
        uVar7 = (this->ColumnsStorage).Size;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x40;
    } while (uVar8 != uVar7);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar4 = (this->ColumnsStorage).Data;
  if (pIVar4 != (ImGuiColumns *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
  }
  pPVar5 = (this->StateStorage).Data.Data;
  if (pPVar5 != (Pair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pPVar5,GImAllocatorUserData);
  }
  puVar6 = (this->IDStack).Data;
  if (puVar6 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
  }
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}